

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O0

PClassActor * __thiscall PClassActor::GetReplacee(PClassActor *this,bool lookskill)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  FSkillInfo *pFVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  PClass *pPVar9;
  FName local_58;
  FName local_54;
  PClassActor *local_50;
  PClassActor *rep;
  PClassActor *savedrep;
  FName local_38;
  FName local_34;
  FName local_30;
  FName local_2c;
  FName local_28;
  undefined1 local_24 [11];
  byte local_19;
  FName skillrepname;
  bool lookskill_local;
  PClassActor *this_local;
  
  local_19 = lookskill;
  _skillrepname = this;
  FName::FName((FName *)(local_24 + 4));
  if ((local_19 & 1) != 0) {
    uVar2 = TArray<FSkillInfo,_FSkillInfo>::Size(&AllSkills);
    uVar3 = FIntCVar::operator_cast_to_int(&gameskill);
    if (uVar3 < uVar2) {
      iVar4 = FIntCVar::operator_cast_to_int(&gameskill);
      pFVar5 = TArray<FSkillInfo,_FSkillInfo>::operator[](&AllSkills,(long)iVar4);
      FName::FName(&local_28,&(this->super_PClass).super_PStruct.super_PNamedType.TypeName);
      FSkillInfo::GetReplacedBy((FSkillInfo *)local_24,&pFVar5->Name);
      FName::operator=((FName *)(local_24 + 4),(FName *)local_24);
      bVar1 = FName::operator!=((FName *)(local_24 + 4),NAME_None);
      if (bVar1) {
        FName::FName(&local_2c,(FName *)(local_24 + 4));
        pPVar9 = PClass::FindClass(&local_2c);
        if (pPVar9 == (PClass *)0x0) {
          iVar4 = FIntCVar::operator_cast_to_int(&gameskill);
          pFVar5 = TArray<FSkillInfo,_FSkillInfo>::operator[](&AllSkills,(long)iVar4);
          pcVar6 = FName::GetChars(&pFVar5->Name);
          pcVar7 = FName::GetChars((FName *)(local_24 + 4));
          pcVar8 = FName::GetChars(&(this->super_PClass).super_PStruct.super_PNamedType.TypeName);
          Printf("Warning: incorrect actor name in definition of skill %s: \nnon-existent class %s is replaced by class %s\nSkill replacement will be ignored for this actor.\n"
                 ,pcVar6,pcVar7,pcVar8);
          iVar4 = FIntCVar::operator_cast_to_int(&gameskill);
          pFVar5 = TArray<FSkillInfo,_FSkillInfo>::operator[](&AllSkills,(long)iVar4);
          FName::FName(&local_30,&(this->super_PClass).super_PStruct.super_PNamedType.TypeName);
          FName::FName(&local_34,NAME_None);
          FSkillInfo::SetReplacedBy(pFVar5,&local_30,&local_34);
          iVar4 = FIntCVar::operator_cast_to_int(&gameskill);
          pFVar5 = TArray<FSkillInfo,_FSkillInfo>::operator[](&AllSkills,(long)iVar4);
          FName::FName(&local_38,(FName *)(local_24 + 4));
          FName::FName((FName *)((long)&savedrep + 4),NAME_None);
          FSkillInfo::SetReplacement(pFVar5,&local_38,(FName *)((long)&savedrep + 4));
          local_19 = 0;
        }
      }
    }
  }
  if ((this->Replacee != (PClassActor *)0x0) ||
     ((this_local = this, (local_19 & 1) != 0 &&
      (bVar1 = FName::operator==((FName *)(local_24 + 4),NAME_None), !bVar1)))) {
    local_50 = this->Replacee;
    this->Replacee = (PClassActor *)0x0;
    rep = local_50;
    if (((local_19 & 1) != 0) &&
       (bVar1 = FName::operator!=((FName *)(local_24 + 4),NAME_None), bVar1)) {
      FName::FName(&local_54,(FName *)(local_24 + 4));
      pPVar9 = PClass::FindClass(&local_54);
      if (pPVar9 != (PClass *)0x0) {
        FName::FName(&local_58,(FName *)(local_24 + 4));
        local_50 = PClass::FindActor(&local_58);
      }
    }
    this_local = GetReplacee(local_50,false);
    this->Replacee = rep;
  }
  return this_local;
}

Assistant:

PClassActor *PClassActor::GetReplacee(bool lookskill)
{
	FName skillrepname;
	
	if (lookskill && AllSkills.Size() > (unsigned)gameskill)
	{
		skillrepname = AllSkills[gameskill].GetReplacedBy(TypeName);
		if (skillrepname != NAME_None && PClass::FindClass(skillrepname) == NULL)
		{
			Printf("Warning: incorrect actor name in definition of skill %s: \n"
				   "non-existent class %s is replaced by class %s\n"
				   "Skill replacement will be ignored for this actor.\n", 
				   AllSkills[gameskill].Name.GetChars(), 
				   skillrepname.GetChars(), TypeName.GetChars());
			AllSkills[gameskill].SetReplacedBy(TypeName, NAME_None);
			AllSkills[gameskill].SetReplacement(skillrepname, NAME_None);
			lookskill = false; 
		}
	}
	if (Replacee == NULL && (!lookskill || skillrepname == NAME_None))
	{
		return this;
	}
	// The Replacee field is temporarily NULLed to prevent
	// potential infinite recursion.
	PClassActor *savedrep = Replacee;
	Replacee = NULL;
	PClassActor *rep = savedrep;
	if (lookskill && (skillrepname != NAME_None) && (PClass::FindClass(skillrepname) != NULL))
	{
		rep = PClass::FindActor(skillrepname);
	}
	rep = rep->GetReplacee(false);
	Replacee = savedrep;
	return rep;
}